

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O2

void __thiscall http::Page::DumpData(Page *this,char *buffer,size_t length)

{
  ostream *poVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  char *local_70;
  size_t local_68;
  string local_50;
  
  poVar2 = &this->m_ostream;
  std::operator<<(poVar2,"<code>\n");
  uVar4 = 0;
  local_70 = buffer;
  local_68 = length;
  do {
    if (length <= uVar4) {
      std::operator<<(poVar2,"</code>\n");
      return;
    }
    to_hex<unsigned_short>(&local_50,(unsigned_short)uVar4,4);
    poVar1 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar1," ");
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = uVar4;
    lVar5 = 0x10;
    while (lVar5 != 0) {
      if (uVar3 < length) {
        to_hex<char>(&local_50,buffer[uVar3],2);
        poVar1 = std::operator<<(poVar2,(string *)&local_50);
        std::operator<<(poVar1," ");
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        std::operator<<(poVar2,"   ");
      }
      if (lVar5 == 9) {
        std::operator<<(poVar2,"- ");
      }
      uVar3 = uVar3 + 1;
      lVar5 = lVar5 + -1;
    }
    std::operator<<(poVar2,"  ");
    sVar6 = 0;
    do {
      if (sVar6 == 0x10) break;
      if ((byte)(local_70[sVar6] + 0x81U) < 0xa1) {
        std::operator<<(poVar2,".");
      }
      else {
        std::operator<<(poVar2,local_70[sVar6]);
      }
      sVar6 = sVar6 + 1;
    } while (local_68 != sVar6);
    uVar4 = uVar4 + 0x10;
    std::operator<<(poVar2,"<br>\n");
    local_70 = local_70 + 0x10;
    local_68 = local_68 - 0x10;
  } while( true );
}

Assistant:

void http::Page::DumpData(const char* buffer, size_t length)
{
    size_t i;
    size_t j;
    std::ostream& out = get_output_stream();

    i = 0;
    j = 0;
    out << "<code>\n";
    while (i + 1 <= length)
    {
        out << to_hex((uint16_t)i) << " ";
        for (j = 0; j < 16; j++)
        {
            if (i + j < length)
            {
                out << to_hex(buffer[i + j]) << " ";
            }
            else
            {
                out << "   ";
            }

            if (j == 7)
            {
                out << "- ";
            }
        }
        out << "  ";
        for (j = 0; j < 16; j++)
        {
            if (buffer[i + j] >= 0x20 && buffer[i + j] <= 0x7E)
            {
                out << buffer[i + j];
            }
            else
            {
                out << ".";
            }
            if (i + j + 1 == length)
            {
                break;
            }
        }

        i += 16;

        out << "<br>\n";
    }
    out << "</code>\n";
}